

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaB_type(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  char *s;
  
  luaL_checkany(L,1);
  pTVar1 = L->base;
  iVar2 = -1;
  if ((pTVar1 != &luaO_nilobject_) && (pTVar1 < L->top)) {
    iVar2 = pTVar1->tt;
  }
  if (iVar2 == -1) {
    s = "no value";
  }
  else {
    s = luaT_typenames[iVar2];
  }
  lua_pushstring(L,s);
  return 1;
}

Assistant:

static int luaB_type(lua_State*L){
luaL_checkany(L,1);
lua_pushstring(L,luaL_typename(L,1));
return 1;
}